

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder_tests.cpp
# Opt level: O1

void __thiscall
json_stream_encoder_reset_test_fixture::json_stream_encoder_reset_test_fixture
          (json_stream_encoder_reset_test_fixture *this)

{
  pointer __s;
  pointer pcVar1;
  value_type *__val;
  allocator<char> local_1c1;
  stream_sink<char> local_1c0;
  long *local_188 [2];
  long local_178 [2];
  undefined1 local_168 [66];
  undefined1 local_126;
  undefined1 local_124;
  string local_118 [32];
  basic_json_options_common<char> local_f8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->output2);
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.stream_ptr_ = (basic_ostream<char,_std::char_traits<char>_> *)this;
  __s = (pointer)operator_new(0x4000);
  pcVar1 = __s + 0x4000;
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s;
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar1;
  memset(__s,0,0x4000);
  local_1c0.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1;
  local_1c0.begin_buffer_ = __s;
  local_1c0.end_buffer_ = pcVar1;
  local_1c0.p_ = __s;
  memset((basic_json_options<char> *)local_168,0,0x148);
  ::jsoncons::basic_json_options<char>::basic_json_options((basic_json_options<char> *)local_168);
  local_124 = 0;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
  std::__cxx11::string::_M_assign(local_118);
  local_126 = 0;
  ::jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
  basic_json_encoder(&this->encoder,&local_1c0,(basic_json_encode_options<char> *)(local_168 + 0x30)
                     ,&local_1c1);
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  ::jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
            ((basic_json_encode_options<char> *)(local_168 + 0x30),
             &PTR_construction_vtable_24__00b58fe8);
  local_168._0_8_ = &PTR__basic_json_decode_options_00b59020;
  local_f8._vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_decode_options_00b59048;
  if ((_Manager_type)local_168._32_8_ != (_Manager_type)0x0) {
    (*(code *)local_168._32_8_)
              ((_Any_data *)(local_168 + 0x10),(_Any_data *)(local_168 + 0x10),__destroy_functor);
  }
  ::jsoncons::basic_json_options_common<char>::~basic_json_options_common(&local_f8);
  ::jsoncons::stream_sink<char>::~stream_sink(&local_1c0);
  return;
}

Assistant:

json_stream_encoder_reset_test_fixture()
        : encoder(output1,
                  json_options().indent_size(0).new_line_chars("")
                      .spaces_around_comma(spaces_option::no_spaces))
    {}